

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PluginManager.cpp
# Opt level: O3

string_view __thiscall
PluginGenericCommand::getHelp(PluginGenericCommand *this,string_view parameters)

{
  bool bVar1;
  size_t sVar2;
  char *pcVar3;
  string_view sVar4;
  basic_string_view<char,_std::char_traits<char>_> rhs;
  basic_string_view<char,_std::char_traits<char>_> rhs_00;
  basic_string_view<char,_std::char_traits<char>_> rhs_01;
  
  rhs._M_str = "load";
  rhs._M_len = 4;
  bVar1 = jessilib::equalsi<char,char>(parameters,rhs);
  if (bVar1) {
    pcVar3 = 
    "Loads a plugin by file name. Do not include a file extension. Syntax: plugin load <plugin>";
    sVar2 = 0x5a;
  }
  else {
    rhs_00._M_str = "unload";
    rhs_00._M_len = 6;
    bVar1 = jessilib::equalsi<char,char>(parameters,rhs_00);
    if (bVar1) {
      pcVar3 = "Unloads a plugin by name. Syntax: plugin unload <plugin>";
      sVar2 = 0x38;
    }
    else {
      rhs_01._M_str = "list";
      rhs_01._M_len = 4;
      bVar1 = jessilib::equalsi<char,char>(parameters,rhs_01);
      sVar2 = 0x5f;
      if (bVar1) {
        sVar2 = 0x40;
      }
      pcVar3 = 
      "Manages plugins. Syntax: plugin {[list], <load> <plugin>, <unload> <plugin>, <reload> [plugin]}"
      ;
      if (bVar1) {
        pcVar3 = "Lists all of the plugins currently loaded. Syntax: plugin [list]";
      }
    }
  }
  sVar4._M_str = pcVar3;
  sVar4._M_len = sVar2;
  return sVar4;
}

Assistant:

std::string_view PluginGenericCommand::getHelp(std::string_view parameters) {
	static constexpr std::string_view loadHelp = "Loads a plugin by file name. Do not include a file extension. Syntax: plugin load <plugin>"sv;
	static constexpr std::string_view unloadHelp = "Unloads a plugin by name. Syntax: plugin unload <plugin>"sv;
	static constexpr std::string_view listHelp = "Lists all of the plugins currently loaded. Syntax: plugin [list]"sv;
	static constexpr std::string_view defaultHelp = "Manages plugins. Syntax: plugin {[list], <load> <plugin>, <unload> <plugin>, <reload> [plugin]}"sv;

	if (jessilib::equalsi(parameters, "load"sv)) {
		return loadHelp;
	}

	if (jessilib::equalsi(parameters, "unload"sv)) {
		return unloadHelp;
	}

	if (jessilib::equalsi(parameters, "list"sv)) {
		return listHelp;
	}

	return defaultHelp;
}